

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef BinaryenGlobalGet(BinaryenModuleRef module,char *name,BinaryenType type)

{
  GlobalGet *pGVar1;
  Type local_40;
  string_view local_38;
  Builder local_28;
  BinaryenType local_20;
  BinaryenType type_local;
  char *name_local;
  BinaryenModuleRef module_local;
  
  local_20 = type;
  type_local = (BinaryenType)name;
  name_local = (char *)module;
  wasm::Builder::Builder(&local_28,module);
  wasm::Name::Name((Name *)&local_38,(char *)type_local);
  wasm::Type::Type(&local_40,local_20);
  pGVar1 = wasm::Builder::makeGlobalGet(&local_28,(Name)local_38,local_40);
  return (BinaryenExpressionRef)pGVar1;
}

Assistant:

BinaryenExpressionRef BinaryenGlobalGet(BinaryenModuleRef module,
                                        const char* name,
                                        BinaryenType type) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeGlobalGet(name, Type(type)));
}